

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

void __thiscall SubprocessSet::Clear(SubprocessSet *this)

{
  Subprocess *this_00;
  bool bVar1;
  reference ppSVar2;
  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
  local_30;
  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
  local_28;
  iterator i_1;
  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
  local_18;
  iterator i;
  SubprocessSet *this_local;
  
  i._M_current = (Subprocess **)this;
  local_18._M_current =
       (Subprocess **)
       std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::begin(&this->running_);
  while( true ) {
    i_1 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::end(&this->running_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&i_1);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
              ::operator*(&local_18);
    if (((*ppSVar2)->use_console_ & 1U) == 0) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                ::operator*(&local_18);
      kill(-(*ppSVar2)->pid_,interrupted_);
    }
    __gnu_cxx::
    __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>::
    operator++(&local_18);
  }
  local_28._M_current =
       (Subprocess **)
       std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::begin(&this->running_);
  while( true ) {
    local_30._M_current =
         (Subprocess **)
         std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::end(&this->running_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
              ::operator*(&local_28);
    this_00 = *ppSVar2;
    if (this_00 != (Subprocess *)0x0) {
      Subprocess::~Subprocess(this_00);
      operator_delete(this_00,0x30);
    }
    __gnu_cxx::
    __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>::
    operator++(&local_28);
  }
  std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::clear(&this->running_);
  return;
}

Assistant:

void SubprocessSet::Clear() {
  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i)
    // Since the foreground process is in our process group, it will receive
    // the interruption signal (i.e. SIGINT or SIGTERM) at the same time as us.
    if (!(*i)->use_console_)
      kill(-(*i)->pid_, interrupted_);
  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i)
    delete *i;
  running_.clear();
}